

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O2

bool __thiscall ON_RTree::CreateMeshFaceTree(ON_RTree *this,ON_Mesh *mesh)

{
  ON_3dPoint *pOVar1;
  double *pdVar2;
  int iVar3;
  ON_MeshFace *pOVar4;
  ON_3fPoint *pOVar5;
  ON_3dPoint *pOVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  bool bVar9;
  ON_3dPointArray *pOVar10;
  double *pdVar11;
  double *pdVar12;
  int *piVar13;
  ulong uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  double dVar26;
  double dVar27;
  ON_3dPoint V;
  double local_e0;
  ON_3dPoint local_d8;
  undefined8 local_b8;
  double local_b0;
  undefined1 local_a8 [8];
  double dStack_a0;
  double local_98;
  double local_90;
  undefined1 local_88 [8];
  double dStack_80;
  double local_78 [2];
  double local_68;
  double dStack_60;
  ON_RTree *local_50;
  double local_48;
  double dStack_40;
  ulong local_38;
  
  local_50 = this;
  RemoveAll(this);
  if (mesh == (ON_Mesh *)0x0) {
    return false;
  }
  local_38 = (ulong)(uint)(mesh->m_F).m_count;
  if (local_38 == 0) {
    return false;
  }
  pOVar4 = (mesh->m_F).m_a;
  if (pOVar4 == (ON_MeshFace *)0x0) {
    return false;
  }
  pOVar5 = (mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a;
  bVar9 = ON_Mesh::HasDoublePrecisionVertices(mesh);
  if (bVar9) {
    pOVar10 = ON_Mesh::DoublePrecisionVertices(mesh);
    pOVar6 = (pOVar10->super_ON_SimpleArray<ON_3dPoint>).m_a;
    if (pOVar5 == (ON_3fPoint *)0x0) {
      if (pOVar6 == (ON_3dPoint *)0x0) {
        return false;
      }
      pdVar2 = (double *)(local_88 + 8);
      piVar13 = pOVar4->vi + 3;
      uVar14 = 0;
      do {
        if (local_38 == uVar14) goto LAB_005b0540;
        pOVar1 = pOVar6 + ((ON_MeshFace *)(piVar13 + -3))->vi[0];
        dVar27 = pOVar1->x;
        dVar23 = pOVar1->y;
        auVar8._0_8_ = pOVar1->x;
        auVar8._8_8_ = pOVar1->y;
        dVar22 = pOVar6[((ON_MeshFace *)(piVar13 + -3))->vi[0]].z;
        uVar15 = SUB84(dVar22,0);
        uVar17 = (undefined4)((ulong)dVar22 >> 0x20);
        local_a8 = (undefined1  [8])pOVar6[piVar13[-2]].x;
        dVar21 = pOVar6[piVar13[-2]].y;
        dVar19 = pOVar6[piVar13[-2]].z;
        uVar24 = SUB84(local_a8,0);
        uVar25 = (undefined4)((ulong)local_a8 >> 0x20);
        if (dVar27 <= (double)local_a8) {
          dVar20 = dVar27;
          _local_88 = auVar8;
          if ((double)local_a8 <= dVar27) goto LAB_005b0368;
          dStack_a0 = dVar23;
        }
        else {
          dStack_80 = dVar23;
          local_88 = local_a8;
          dVar20 = (double)local_a8;
LAB_005b0368:
          uVar24 = SUB84(dVar27,0);
          uVar25 = (undefined4)((ulong)dVar27 >> 0x20);
          dVar27 = dVar20;
          _local_a8 = auVar8;
        }
        local_98 = dVar22;
        local_78[0] = dVar22;
        if (dVar23 <= dVar21) {
          pdVar12 = (double *)(local_a8 + 8);
          uVar16 = SUB84(dVar21,0);
          uVar18 = (undefined4)((ulong)dVar21 >> 0x20);
          dVar20 = dVar23;
          if (dVar23 < dVar21) goto LAB_005b039c;
        }
        else {
          uVar16 = SUB84(dVar23,0);
          uVar18 = (undefined4)((ulong)dVar23 >> 0x20);
          pdVar12 = pdVar2;
          dVar23 = dVar21;
LAB_005b039c:
          *pdVar12 = dVar21;
          dVar20 = (double)CONCAT44(uVar18,uVar16);
        }
        uVar16 = SUB84(dVar19,0);
        uVar18 = (undefined4)((ulong)dVar19 >> 0x20);
        pdVar12 = local_78;
        dVar21 = dVar22;
        if ((dVar19 < dVar22) ||
           (pdVar12 = &local_98, uVar16 = uVar15, uVar18 = uVar17, dVar21 = dVar19, dVar22 < dVar19)
           ) {
          dVar22 = dVar21;
          *pdVar12 = dVar19;
          uVar15 = uVar16;
          uVar17 = uVar18;
        }
        local_d8.x = pOVar6[piVar13[-1]].x;
        local_d8.y = pOVar6[piVar13[-1]].y;
        local_d8.z = pOVar6[piVar13[-1]].z;
        if (dVar27 <= local_d8.x) {
          if ((double)CONCAT44(uVar25,uVar24) <= local_d8.x &&
              local_d8.x != (double)CONCAT44(uVar25,uVar24)) {
            local_a8 = (undefined1  [8])local_d8.x;
            uVar24 = SUB84(local_d8.x,0);
            uVar25 = (int)((ulong)local_d8.x >> 0x20);
          }
        }
        else {
          local_88 = (undefined1  [8])local_d8.x;
          dVar27 = local_d8.x;
        }
        pdVar12 = pdVar2;
        dVar19 = local_d8.y;
        dVar21 = dVar20;
        if ((local_d8.y < dVar23) ||
           (pdVar12 = (double *)(local_a8 + 8), dVar19 = dVar23, dVar21 = local_d8.y,
           dVar20 < local_d8.y)) {
          dVar20 = dVar21;
          *pdVar12 = local_d8.y;
          dVar23 = dVar19;
        }
        uVar16 = SUB84(local_d8.z,0);
        uVar18 = (undefined4)((ulong)local_d8.z >> 0x20);
        pdVar12 = local_78;
        dVar19 = dVar22;
        if ((local_d8.z <= (double)CONCAT44(uVar17,uVar15) &&
             (double)CONCAT44(uVar17,uVar15) != local_d8.z) ||
           (pdVar12 = &local_98, uVar16 = uVar15, uVar18 = uVar17, dVar19 = local_d8.z,
           dVar22 < local_d8.z)) {
          dVar22 = dVar19;
          *pdVar12 = local_d8.z;
          uVar15 = uVar16;
          uVar17 = uVar18;
        }
        iVar3 = *piVar13;
        if (piVar13[-1] != iVar3) {
          local_d8.x = pOVar6[iVar3].x;
          local_d8.y = pOVar6[iVar3].y;
          local_d8.z = pOVar6[iVar3].z;
          if (dVar27 <= local_d8.x) {
            if ((double)CONCAT44(uVar25,uVar24) <= local_d8.x &&
                local_d8.x != (double)CONCAT44(uVar25,uVar24)) {
              local_a8 = (undefined1  [8])local_d8.x;
            }
          }
          else {
            local_88 = (undefined1  [8])local_d8.x;
          }
          pdVar12 = pdVar2;
          if ((local_d8.y < dVar23) || (pdVar12 = (double *)(local_a8 + 8), dVar20 < local_d8.y)) {
            *pdVar12 = local_d8.y;
          }
          pdVar12 = local_78;
          if ((local_d8.z <= (double)CONCAT44(uVar17,uVar15) &&
               (double)CONCAT44(uVar17,uVar15) != local_d8.z) ||
             (pdVar12 = &local_98, dVar22 < local_d8.z)) {
            *pdVar12 = local_d8.z;
          }
        }
        bVar9 = Insert(local_50,(double *)local_88,(double *)local_a8,(int)uVar14);
        uVar14 = uVar14 + 1;
        piVar13 = piVar13 + 4;
      } while (bVar9);
      goto LAB_005b051f;
    }
    if (pOVar6 != (ON_3dPoint *)0x0) {
      pdVar2 = (double *)(local_a8 + 8);
      pdVar12 = (double *)(local_88 + 8);
      piVar13 = pOVar4->vi + 3;
      uVar14 = 0;
      do {
        if (local_38 == uVar14) {
LAB_005b0540:
          return local_50->m_root != (ON_RTreeNode *)0x0;
        }
        ON_3dPoint::operator=(&local_d8,pOVar5 + ((ON_MeshFace *)(piVar13 + -3))->vi[0]);
        auVar7._8_8_ = local_d8.y;
        auVar7._0_8_ = local_d8.x;
        uVar15 = SUB84(local_d8.z,0);
        uVar17 = (undefined4)((ulong)local_d8.z >> 0x20);
        local_98 = local_d8.z;
        local_78[0] = local_d8.z;
        dVar19 = pOVar6[((ON_MeshFace *)(piVar13 + -3))->vi[0]].x;
        dVar27 = pOVar6[((ON_MeshFace *)(piVar13 + -3))->vi[0]].y;
        dVar22 = pOVar6[((ON_MeshFace *)(piVar13 + -3))->vi[0]].z;
        local_b0 = local_d8.x;
        _local_a8 = auVar7;
        if (local_d8.x <= dVar19) {
          _local_88 = auVar7;
          if (local_d8.x < dVar19) {
            dStack_a0 = local_d8.y;
            local_a8 = (undefined1  [8])dVar19;
            local_b0 = dVar19;
          }
        }
        else {
          dStack_80 = local_d8.y;
          local_88 = (undefined1  [8])dVar19;
          local_d8.x = dVar19;
        }
        if (local_d8.y <= dVar27) {
          local_b8._0_4_ = SUB84(local_d8.y,0);
          local_b8._4_4_ = (undefined4)((ulong)local_d8.y >> 0x20);
          pdVar11 = pdVar2;
          dVar23 = dVar27;
          dStack_40 = local_d8.y;
          if (local_d8.y < dVar27) goto LAB_005afa0a;
        }
        else {
          pdVar11 = pdVar12;
          dVar23 = local_d8.y;
          local_d8.y = dVar27;
          dStack_40 = 0.0;
LAB_005afa0a:
          *pdVar11 = dVar27;
          local_b8._0_4_ = SUB84(dVar23,0);
          local_b8._4_4_ = (undefined4)((ulong)dVar23 >> 0x20);
        }
        local_90 = local_d8.x;
        if (local_d8.z <= dVar22) {
          pdVar11 = &local_98;
          local_68 = local_d8.z;
          dVar23 = dVar22;
          if (local_d8.z < dVar22) goto LAB_005afa65;
        }
        else {
          pdVar11 = local_78;
          dVar23 = local_d8.z;
          local_68 = dVar22;
LAB_005afa65:
          *pdVar11 = dVar22;
          uVar15 = SUB84(dVar23,0);
          uVar17 = (undefined4)((ulong)dVar23 >> 0x20);
        }
        dVar23 = (double)CONCAT44(uVar17,uVar15);
        local_d8.x = dVar19;
        local_48 = local_d8.y;
        local_d8.y = dVar27;
        local_d8.z = dVar22;
        ON_3dPoint::operator=(&local_d8,pOVar5 + piVar13[-2]);
        uVar15 = (undefined4)((ulong)local_68 >> 0x20);
        if (local_90 <= local_d8.x) {
          dVar22 = local_90;
          if (local_b0 < local_d8.x) {
            local_a8 = (undefined1  [8])local_d8.x;
            local_b0 = local_d8.x;
          }
        }
        else {
          local_88 = (undefined1  [8])local_d8.x;
          dVar22 = local_d8.x;
        }
        uVar17 = SUB84(local_68,0);
        if (local_48 <= local_d8.y) {
          pdVar11 = pdVar2;
          dVar19 = local_d8.y;
          if ((double)CONCAT44(local_b8._4_4_,(undefined4)local_b8) <= local_d8.y &&
              local_d8.y != (double)CONCAT44(local_b8._4_4_,(undefined4)local_b8))
          goto LAB_005afb1f;
        }
        else {
          dStack_40 = 0.0;
          pdVar11 = pdVar12;
          dVar19 = (double)CONCAT44(local_b8._4_4_,(undefined4)local_b8);
          local_48 = local_d8.y;
LAB_005afb1f:
          *pdVar11 = local_d8.y;
          local_b8._0_4_ = SUB84(dVar19,0);
          local_b8._4_4_ = (undefined4)((ulong)dVar19 >> 0x20);
        }
        if (local_68 <= local_d8.z) {
          pdVar11 = &local_98;
          dVar19 = local_d8.z;
          if (dVar23 < local_d8.z) goto LAB_005afb51;
        }
        else {
          pdVar11 = local_78;
          uVar17 = SUB84(local_d8.z,0);
          uVar15 = (undefined4)((ulong)local_d8.z >> 0x20);
          dVar19 = dVar23;
LAB_005afb51:
          *pdVar11 = local_d8.z;
          dVar23 = dVar19;
        }
        local_d8.x = pOVar6[piVar13[-2]].x;
        local_d8.y = pOVar6[piVar13[-2]].y;
        local_d8.z = pOVar6[piVar13[-2]].z;
        if (dVar22 <= local_d8.x) {
          if (local_b0 < local_d8.x) {
            local_a8 = (undefined1  [8])local_d8.x;
            local_b0 = local_d8.x;
          }
        }
        else {
          local_88 = (undefined1  [8])local_d8.x;
          dVar22 = local_d8.x;
        }
        if (local_48 <= local_d8.y) {
          pdVar11 = pdVar2;
          dVar19 = local_d8.y;
          if ((double)CONCAT44(local_b8._4_4_,(undefined4)local_b8) <= local_d8.y &&
              local_d8.y != (double)CONCAT44(local_b8._4_4_,(undefined4)local_b8))
          goto LAB_005afbc4;
        }
        else {
          dStack_40 = 0.0;
          pdVar11 = pdVar12;
          dVar19 = (double)CONCAT44(local_b8._4_4_,(undefined4)local_b8);
          local_48 = local_d8.y;
LAB_005afbc4:
          *pdVar11 = local_d8.y;
          local_b8._0_4_ = SUB84(dVar19,0);
          local_b8._4_4_ = (undefined4)((ulong)dVar19 >> 0x20);
        }
        local_90 = dVar22;
        if ((double)CONCAT44(uVar15,uVar17) < local_d8.z ||
            (double)CONCAT44(uVar15,uVar17) == local_d8.z) {
          local_68 = (double)CONCAT44(uVar15,uVar17);
          pdVar11 = &local_98;
          dVar22 = local_d8.z;
          if (dVar23 < local_d8.z) goto LAB_005afc1f;
        }
        else {
          pdVar11 = local_78;
          dVar22 = dVar23;
          local_68 = local_d8.z;
LAB_005afc1f:
          *pdVar11 = local_d8.z;
          dVar23 = dVar22;
        }
        ON_3dPoint::operator=(&local_d8,pOVar5 + piVar13[-1]);
        dVar22 = local_68;
        uVar15 = (undefined4)((ulong)local_68 >> 0x20);
        uVar17 = (undefined4)((ulong)local_b8 >> 0x20);
        dVar19 = local_b0;
        if (local_90 <= local_d8.x) {
          dVar27 = local_90;
          if (local_b0 < local_d8.x) {
            local_a8 = (undefined1  [8])local_d8.x;
            dVar19 = local_d8.x;
          }
        }
        else {
          local_88 = (undefined1  [8])local_d8.x;
          dVar27 = local_d8.x;
        }
        uVar25 = SUB84(local_b8,0);
        uVar24 = SUB84(local_68,0);
        if (local_48 <= local_d8.y) {
          pdVar11 = pdVar2;
          dVar20 = local_d8.y;
          dVar26 = local_48;
          dVar21 = dStack_40;
          if (local_b8 < local_d8.y) goto LAB_005afcd9;
        }
        else {
          pdVar11 = pdVar12;
          dVar20 = local_b8;
          dVar26 = local_d8.y;
          dVar21 = 0.0;
LAB_005afcd9:
          *pdVar11 = local_d8.y;
          uVar25 = SUB84(dVar20,0);
          uVar17 = (undefined4)((ulong)dVar20 >> 0x20);
        }
        if (dVar22 <= local_d8.z) {
          pdVar11 = &local_98;
          dVar22 = local_d8.z;
          if (dVar23 < local_d8.z) goto LAB_005afd0b;
        }
        else {
          pdVar11 = local_78;
          uVar24 = SUB84(local_d8.z,0);
          uVar15 = (undefined4)((ulong)local_d8.z >> 0x20);
          dVar22 = dVar23;
LAB_005afd0b:
          *pdVar11 = local_d8.z;
          dVar23 = dVar22;
        }
        local_d8.x = pOVar6[piVar13[-1]].x;
        local_d8.y = pOVar6[piVar13[-1]].y;
        local_d8.z = pOVar6[piVar13[-1]].z;
        if (dVar27 <= local_d8.x) {
          if (dVar19 < local_d8.x) {
            local_a8 = (undefined1  [8])local_d8.x;
            dVar19 = local_d8.x;
          }
        }
        else {
          local_88 = (undefined1  [8])local_d8.x;
          dVar27 = local_d8.x;
        }
        if (dVar26 <= local_d8.y) {
          pdVar11 = pdVar2;
          dVar22 = local_d8.y;
          if ((double)CONCAT44(uVar17,uVar25) <= local_d8.y &&
              local_d8.y != (double)CONCAT44(uVar17,uVar25)) goto LAB_005afd7e;
        }
        else {
          dVar21 = 0.0;
          pdVar11 = pdVar12;
          dVar22 = (double)CONCAT44(uVar17,uVar25);
          dVar26 = local_d8.y;
LAB_005afd7e:
          *pdVar11 = local_d8.y;
          uVar25 = SUB84(dVar22,0);
          uVar17 = (undefined4)((ulong)dVar22 >> 0x20);
        }
        if ((double)CONCAT44(uVar15,uVar24) < local_d8.z ||
            (double)CONCAT44(uVar15,uVar24) == local_d8.z) {
          pdVar11 = &local_98;
          dVar22 = local_d8.z;
          if (dVar23 < local_d8.z) goto LAB_005afdb0;
        }
        else {
          pdVar11 = local_78;
          uVar24 = SUB84(local_d8.z,0);
          uVar15 = (undefined4)((ulong)local_d8.z >> 0x20);
          dVar22 = dVar23;
LAB_005afdb0:
          *pdVar11 = local_d8.z;
          dVar23 = dVar22;
        }
        if (piVar13[-1] != *piVar13) {
          local_b8 = (double)CONCAT44(uVar17,uVar25);
          local_68 = (double)CONCAT44(uVar15,uVar24);
          local_b0 = dVar19;
          local_90 = dVar27;
          local_48 = dVar26;
          dStack_40 = dVar21;
          ON_3dPoint::operator=(&local_d8,pOVar5 + *piVar13);
          dVar22 = local_68;
          uVar15 = (undefined4)((ulong)local_68 >> 0x20);
          uVar17 = (undefined4)((ulong)local_b8 >> 0x20);
          dVar19 = local_b0;
          if (local_90 <= local_d8.x) {
            dVar27 = local_90;
            if (local_b0 < local_d8.x) {
              local_a8 = (undefined1  [8])local_d8.x;
              dVar19 = local_d8.x;
            }
          }
          else {
            local_88 = (undefined1  [8])local_d8.x;
            dVar27 = local_d8.x;
          }
          uVar25 = SUB84(local_b8,0);
          uVar24 = SUB84(local_68,0);
          pdVar11 = pdVar12;
          dVar21 = local_b8;
          dVar20 = local_d8.y;
          if ((local_d8.y < local_48) ||
             (pdVar11 = pdVar2, dVar21 = local_d8.y, dVar20 = local_48, local_b8 < local_d8.y)) {
            *pdVar11 = local_d8.y;
            uVar25 = SUB84(dVar21,0);
            uVar17 = (undefined4)((ulong)dVar21 >> 0x20);
          }
          if (dVar22 <= local_d8.z) {
            pdVar11 = &local_98;
            dVar22 = local_d8.z;
            if (dVar23 < local_d8.z) goto LAB_005afeca;
          }
          else {
            pdVar11 = local_78;
            uVar24 = SUB84(local_d8.z,0);
            uVar15 = (undefined4)((ulong)local_d8.z >> 0x20);
            dVar22 = dVar23;
LAB_005afeca:
            *pdVar11 = local_d8.z;
            dVar23 = dVar22;
          }
          local_d8.x = pOVar6[*piVar13].x;
          local_d8.y = pOVar6[*piVar13].y;
          local_d8.z = pOVar6[*piVar13].z;
          if (dVar27 <= local_d8.x) {
            if (dVar19 < local_d8.x) {
              local_a8 = (undefined1  [8])local_d8.x;
            }
          }
          else {
            local_88 = (undefined1  [8])local_d8.x;
          }
          pdVar11 = pdVar12;
          if ((local_d8.y < dVar20) ||
             (pdVar11 = pdVar2,
             (double)CONCAT44(uVar17,uVar25) <= local_d8.y &&
             local_d8.y != (double)CONCAT44(uVar17,uVar25))) {
            *pdVar11 = local_d8.y;
          }
          pdVar11 = local_78;
          if ((local_d8.z <= (double)CONCAT44(uVar15,uVar24) &&
               (double)CONCAT44(uVar15,uVar24) != local_d8.z) ||
             (pdVar11 = &local_98, dVar23 < local_d8.z)) {
            *pdVar11 = local_d8.z;
          }
        }
        bVar9 = Insert(local_50,(double *)local_88,(double *)local_a8,(int)uVar14);
        uVar14 = uVar14 + 1;
        piVar13 = piVar13 + 4;
      } while (bVar9);
      goto LAB_005b051f;
    }
  }
  else if (pOVar5 == (ON_3fPoint *)0x0) {
    return false;
  }
  pdVar2 = (double *)(local_88 + 8);
  piVar13 = pOVar4->vi + 3;
  uVar14 = 0;
  do {
    if (local_38 == uVar14) goto LAB_005b0540;
    ON_3dPoint::operator=(&local_d8,pOVar5 + ((ON_MeshFace *)(piVar13 + -3))->vi[0]);
    dVar22 = local_d8.z;
    local_68 = local_d8.x;
    dStack_60 = local_d8.y;
    dStack_a0 = local_d8.y;
    local_a8 = (undefined1  [8])local_d8.x;
    dStack_80 = local_d8.y;
    local_88 = (undefined1  [8])local_d8.x;
    local_98 = local_d8.z;
    local_e0 = local_d8.z;
    local_78[0] = local_d8.z;
    ON_3dPoint::operator=(&local_d8,pOVar5 + piVar13[-2]);
    if (local_68 <= local_d8.x) {
      if (local_d8.x <= local_68) {
        local_48 = local_68;
        goto LAB_005b0048;
      }
      local_90 = local_d8.x;
      local_a8 = (undefined1  [8])local_d8.x;
      local_48 = local_68;
    }
    else {
      local_88 = (undefined1  [8])local_d8.x;
      local_48 = local_d8.x;
LAB_005b0048:
      local_90 = local_68;
    }
    uVar15 = SUB84(dVar22,0);
    uVar17 = (undefined4)((ulong)dVar22 >> 0x20);
    if (dStack_60 <= local_d8.y) {
      pdVar12 = (double *)(local_a8 + 8);
      dVar19 = local_d8.y;
      dVar27 = dStack_60;
      local_b0 = dStack_60;
      if (dStack_60 < local_d8.y) goto LAB_005b0084;
    }
    else {
      pdVar12 = pdVar2;
      dVar19 = dStack_60;
      dStack_60 = local_d8.y;
      dVar27 = 0.0;
LAB_005b0084:
      *pdVar12 = local_d8.y;
      local_b0 = dVar19;
    }
    local_68 = dStack_60;
    if (dVar22 <= local_d8.z) {
      pdVar12 = &local_98;
      dVar19 = local_d8.z;
      if (dVar22 < local_d8.z) goto LAB_005b00c5;
    }
    else {
      local_e0 = local_d8.z;
      pdVar12 = local_78;
      dVar19 = dVar22;
LAB_005b00c5:
      dStack_60 = dVar27;
      *pdVar12 = local_d8.z;
      uVar15 = SUB84(dVar19,0);
      uVar17 = (undefined4)((ulong)dVar19 >> 0x20);
      dVar27 = dStack_60;
    }
    dStack_60 = dVar27;
    local_b8 = (double)CONCAT44(uVar17,uVar15);
    ON_3dPoint::operator=(&local_d8,pOVar5 + piVar13[-1]);
    uVar15 = (undefined4)((ulong)local_e0 >> 0x20);
    if (local_48 <= local_d8.x) {
      if (local_90 < local_d8.x) {
        local_a8 = (undefined1  [8])local_d8.x;
        local_90 = local_d8.x;
      }
    }
    else {
      local_88 = (undefined1  [8])local_d8.x;
      local_48 = local_d8.x;
    }
    uVar17 = SUB84(local_e0,0);
    if (local_68 <= local_d8.y) {
      pdVar12 = (double *)(local_a8 + 8);
      dVar22 = local_d8.y;
      dVar19 = local_68;
      dVar27 = dStack_60;
      dVar23 = local_b0;
      if (local_b0 < local_d8.y) goto LAB_005b0179;
    }
    else {
      pdVar12 = pdVar2;
      dVar22 = local_b0;
      dVar19 = local_d8.y;
      dVar27 = 0.0;
LAB_005b0179:
      *pdVar12 = local_d8.y;
      dVar23 = dVar22;
    }
    if (local_e0 <= local_d8.z) {
      pdVar12 = &local_98;
      dVar22 = local_d8.z;
      dVar21 = local_b8;
      if (local_b8 < local_d8.z) goto LAB_005b01a9;
    }
    else {
      uVar17 = SUB84(local_d8.z,0);
      uVar15 = (undefined4)((ulong)local_d8.z >> 0x20);
      pdVar12 = local_78;
      dVar22 = local_b8;
LAB_005b01a9:
      *pdVar12 = local_d8.z;
      dVar21 = dVar22;
    }
    if (piVar13[-1] != *piVar13) {
      local_b8 = dVar21;
      local_b0 = dVar23;
      local_68 = dVar19;
      dStack_60 = dVar27;
      ON_3dPoint::operator=(&local_d8,pOVar5 + *piVar13);
      if (local_48 <= local_d8.x) {
        if (local_90 < local_d8.x) {
          local_a8 = (undefined1  [8])local_d8.x;
        }
      }
      else {
        local_88 = (undefined1  [8])local_d8.x;
      }
      pdVar12 = pdVar2;
      if ((local_d8.y < local_68) || (pdVar12 = (double *)(local_a8 + 8), local_b0 < local_d8.y)) {
        *pdVar12 = local_d8.y;
      }
      pdVar12 = local_78;
      if ((local_d8.z < (double)CONCAT44(uVar15,uVar17)) ||
         (pdVar12 = &local_98, local_b8 < local_d8.z)) {
        *pdVar12 = local_d8.z;
      }
    }
    bVar9 = Insert(local_50,(double *)local_88,(double *)local_a8,(int)uVar14);
    uVar14 = uVar14 + 1;
    piVar13 = piVar13 + 4;
  } while (bVar9);
LAB_005b051f:
  RemoveAll(local_50);
  return false;
}

Assistant:

bool ON_RTree::CreateMeshFaceTree( const ON_Mesh* mesh )
{
  double fmin[3], fmax[3];
  ON_3dPoint V;
  unsigned int fi, fcount;
  const int* fvi;
  const ON_MeshFace* meshF;
  const ON_3fPoint* meshfV;
  const ON_3dPoint* meshdV;

  RemoveAll();

  if ( 0 == mesh )
    return false;

  fcount = mesh->m_F.UnsignedCount();
  if ( fcount <= 0 )
    return false;

  meshF = mesh->m_F.Array();
  if ( 0 == meshF )
    return false;

  meshfV = mesh->m_V.Array();

  meshdV = mesh->HasDoublePrecisionVertices() 
         ? mesh->DoublePrecisionVertices().Array() 
         : 0;

  if ( 0 != meshfV )
  {
    if ( 0 != meshdV )
    {
      for ( fi = 0; fi < fcount; fi++ )
      {
        fvi = meshF[fi].vi;

        V = meshfV[fvi[0]];
        fmin[0] = fmax[0] = V.x;
        fmin[1] = fmax[1] = V.y;
        fmin[2] = fmax[2] = V.z;
        V = meshdV[fvi[0]];
        if ( V.x < fmin[0] ) fmin[0] = V.x; else if ( V.x > fmax[0] ) fmax[0] = V.x;
        if ( V.y < fmin[1] ) fmin[1] = V.y; else if ( V.y > fmax[1] ) fmax[1] = V.y;
        if ( V.z < fmin[2] ) fmin[2] = V.z; else if ( V.z > fmax[2] ) fmax[2] = V.z;  

        V = meshfV[fvi[1]];
        if ( V.x < fmin[0] ) fmin[0] = V.x; else if ( V.x > fmax[0] ) fmax[0] = V.x;
        if ( V.y < fmin[1] ) fmin[1] = V.y; else if ( V.y > fmax[1] ) fmax[1] = V.y;
        if ( V.z < fmin[2] ) fmin[2] = V.z; else if ( V.z > fmax[2] ) fmax[2] = V.z;  
        V = meshdV[fvi[1]];
        if ( V.x < fmin[0] ) fmin[0] = V.x; else if ( V.x > fmax[0] ) fmax[0] = V.x;
        if ( V.y < fmin[1] ) fmin[1] = V.y; else if ( V.y > fmax[1] ) fmax[1] = V.y;
        if ( V.z < fmin[2] ) fmin[2] = V.z; else if ( V.z > fmax[2] ) fmax[2] = V.z;  

        V = meshfV[fvi[2]];
        if ( V.x < fmin[0] ) fmin[0] = V.x; else if ( V.x > fmax[0] ) fmax[0] = V.x;
        if ( V.y < fmin[1] ) fmin[1] = V.y; else if ( V.y > fmax[1] ) fmax[1] = V.y;
        if ( V.z < fmin[2] ) fmin[2] = V.z; else if ( V.z > fmax[2] ) fmax[2] = V.z;  
        V = meshdV[fvi[2]];
        if ( V.x < fmin[0] ) fmin[0] = V.x; else if ( V.x > fmax[0] ) fmax[0] = V.x;
        if ( V.y < fmin[1] ) fmin[1] = V.y; else if ( V.y > fmax[1] ) fmax[1] = V.y;
        if ( V.z < fmin[2] ) fmin[2] = V.z; else if ( V.z > fmax[2] ) fmax[2] = V.z;  

        if ( fvi[2] != fvi[3] )
        {
          V = meshfV[fvi[3]];
          if ( V.x < fmin[0] ) fmin[0] = V.x; else if ( V.x > fmax[0] ) fmax[0] = V.x;
          if ( V.y < fmin[1] ) fmin[1] = V.y; else if ( V.y > fmax[1] ) fmax[1] = V.y;
          if ( V.z < fmin[2] ) fmin[2] = V.z; else if ( V.z > fmax[2] ) fmax[2] = V.z;      
          V = meshdV[fvi[3]];
          if ( V.x < fmin[0] ) fmin[0] = V.x; else if ( V.x > fmax[0] ) fmax[0] = V.x;
          if ( V.y < fmin[1] ) fmin[1] = V.y; else if ( V.y > fmax[1] ) fmax[1] = V.y;
          if ( V.z < fmin[2] ) fmin[2] = V.z; else if ( V.z > fmax[2] ) fmax[2] = V.z;  
        }

        if ( !Insert(fmin,fmax,fi) )
        {
          RemoveAll();
          return false;
        }
      }
    }
    else
    {
      for ( fi = 0; fi < fcount; fi++ )
      {
        fvi = meshF[fi].vi;

        V = meshfV[fvi[0]];
        fmin[0] = fmax[0] = V.x;
        fmin[1] = fmax[1] = V.y;
        fmin[2] = fmax[2] = V.z;

        V = meshfV[fvi[1]];
        if ( V.x < fmin[0] ) fmin[0] = V.x; else if ( V.x > fmax[0] ) fmax[0] = V.x;
        if ( V.y < fmin[1] ) fmin[1] = V.y; else if ( V.y > fmax[1] ) fmax[1] = V.y;
        if ( V.z < fmin[2] ) fmin[2] = V.z; else if ( V.z > fmax[2] ) fmax[2] = V.z;  

        V = meshfV[fvi[2]];
        if ( V.x < fmin[0] ) fmin[0] = V.x; else if ( V.x > fmax[0] ) fmax[0] = V.x;
        if ( V.y < fmin[1] ) fmin[1] = V.y; else if ( V.y > fmax[1] ) fmax[1] = V.y;
        if ( V.z < fmin[2] ) fmin[2] = V.z; else if ( V.z > fmax[2] ) fmax[2] = V.z;  

        if ( fvi[2] != fvi[3] )
        {
          V = meshfV[fvi[3]];
          if ( V.x < fmin[0] ) fmin[0] = V.x; else if ( V.x > fmax[0] ) fmax[0] = V.x;
          if ( V.y < fmin[1] ) fmin[1] = V.y; else if ( V.y > fmax[1] ) fmax[1] = V.y;
          if ( V.z < fmin[2] ) fmin[2] = V.z; else if ( V.z > fmax[2] ) fmax[2] = V.z;      
        }

        if ( !Insert(fmin,fmax,fi) )
        {
          RemoveAll();
          return false;
        }
      }
    }
  }
  else if ( 0 != meshdV )
  {
    for ( fi = 0; fi < fcount; fi++ )
    {
      fvi = meshF[fi].vi;

      V = meshdV[fvi[0]];
      fmin[0] = fmax[0] = V.x;
      fmin[1] = fmax[1] = V.y;
      fmin[2] = fmax[2] = V.z;

      V = meshdV[fvi[1]];
      if ( V.x < fmin[0] ) fmin[0] = V.x; else if ( V.x > fmax[0] ) fmax[0] = V.x;
      if ( V.y < fmin[1] ) fmin[1] = V.y; else if ( V.y > fmax[1] ) fmax[1] = V.y;
      if ( V.z < fmin[2] ) fmin[2] = V.z; else if ( V.z > fmax[2] ) fmax[2] = V.z;  

      V = meshdV[fvi[2]];
      if ( V.x < fmin[0] ) fmin[0] = V.x; else if ( V.x > fmax[0] ) fmax[0] = V.x;
      if ( V.y < fmin[1] ) fmin[1] = V.y; else if ( V.y > fmax[1] ) fmax[1] = V.y;
      if ( V.z < fmin[2] ) fmin[2] = V.z; else if ( V.z > fmax[2] ) fmax[2] = V.z;  

      if ( fvi[2] != fvi[3] )
      {
        V = meshdV[fvi[3]];
        if ( V.x < fmin[0] ) fmin[0] = V.x; else if ( V.x > fmax[0] ) fmax[0] = V.x;
        if ( V.y < fmin[1] ) fmin[1] = V.y; else if ( V.y > fmax[1] ) fmax[1] = V.y;
        if ( V.z < fmin[2] ) fmin[2] = V.z; else if ( V.z > fmax[2] ) fmax[2] = V.z;      
      }

      if ( !Insert(fmin,fmax,fi) )
      {
        RemoveAll();
        return false;
      }
    }
  }
  else
  {
    // no vertices
    return false;
  }

  return (0 != m_root);
}